

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationYY<std::complex<double>_>::matrix(RotationYY<std::complex<double>_> *this)

{
  complex<double> m02;
  complex<double> m03;
  complex<double> m10;
  complex<double> m11;
  complex<double> m12;
  complex<double> m13;
  complex<double> m20;
  complex<double> m21;
  complex<double> m22;
  complex<double> m23;
  complex<double> m30;
  complex<double> m31;
  complex<double> m32;
  complex<double> m33;
  data_type extraout_RDX;
  QRotationGate2<std::complex<double>_> *in_RSI;
  double in_XMM0_Qa;
  double dVar1;
  double __x;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar2;
  SquareMatrix<std::complex<double>_> SVar3;
  complex<double> m00;
  complex<double> m01;
  RotationYY<std::complex<double>_> *pRVar4;
  complex<double> local_150;
  complex<double> local_140 [2];
  complex<double> local_120 [2];
  undefined8 local_100;
  undefined8 local_f8;
  complex<double> local_f0;
  complex<double> local_e0;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  complex<double> local_b0 [2];
  complex<double> local_90;
  complex<double> local_80 [2];
  undefined1 local_60 [8];
  complex<double> o;
  complex<double> d;
  RotationYY<std::complex<double>_> *this_local;
  
  pRVar4 = this;
  dVar1 = QRotationGate2<std::complex<double>_>::cos(in_RSI,in_XMM0_Qa);
  std::complex<double>::complex((complex<double> *)(o._M_value + 8),dVar1,0.0);
  dVar1 = QRotationGate2<std::complex<double>_>::sin(in_RSI,__x);
  std::complex<double>::complex((complex<double> *)local_60,0.0,dVar1);
  local_80[1]._M_value._0_8_ = o._M_value._8_8_;
  std::complex<double>::complex(local_80,0.0,0.0);
  std::complex<double>::complex(&local_90,0.0,0.0);
  local_b0[1]._M_value._0_8_ = local_60;
  local_b0[1]._M_value._8_8_ = o._M_value._0_8_;
  uVar2 = 0;
  std::complex<double>::complex(local_b0,0.0,0.0);
  local_c0 = o._M_value._8_8_;
  local_b8 = d._M_value._0_8_;
  std::operator-((complex<double> *)local_60);
  local_d0 = extraout_XMM0_Qa;
  local_c8 = uVar2;
  std::complex<double>::complex(&local_e0,0.0,0.0);
  uVar2 = 0;
  std::complex<double>::complex(&local_f0,0.0,0.0);
  std::operator-((complex<double> *)local_60);
  local_120[1]._M_value._0_8_ = o._M_value._8_8_;
  local_120[1]._M_value._8_8_ = d._M_value._0_8_;
  local_100 = extraout_XMM0_Qa_00;
  local_f8 = uVar2;
  std::complex<double>::complex(local_120,0.0,0.0);
  local_140[1]._M_value._0_8_ = local_60;
  local_140[1]._M_value._8_8_ = o._M_value._0_8_;
  std::complex<double>::complex(local_140,0.0,0.0);
  std::complex<double>::complex(&local_150,0.0,0.0);
  m02._M_value._8_8_ = local_b0[0]._M_value._8_8_;
  m02._M_value._0_8_ = local_b0[0]._M_value._0_8_;
  m03._M_value._8_8_ = local_b8;
  m03._M_value._0_8_ = local_c0;
  m10._M_value._8_8_ = local_c8;
  m10._M_value._0_8_ = local_d0;
  m11._M_value._8_8_ = local_e0._M_value._8_8_;
  m11._M_value._0_8_ = local_e0._M_value._0_8_;
  m12._M_value._8_8_ = local_f0._M_value._8_8_;
  m12._M_value._0_8_ = local_f0._M_value._0_8_;
  m13._M_value._8_8_ = local_f8;
  m13._M_value._0_8_ = local_100;
  m20._M_value._8_8_ = local_120[1]._M_value._8_8_;
  m20._M_value._0_8_ = local_120[1]._M_value._0_8_;
  m21._M_value._8_8_ = local_120[0]._M_value._8_8_;
  m21._M_value._0_8_ = local_120[0]._M_value._0_8_;
  m22._M_value._8_8_ = local_140[1]._M_value._8_8_;
  m22._M_value._0_8_ = local_140[1]._M_value._0_8_;
  m23._M_value._8_8_ = local_140[0]._M_value._8_8_;
  m23._M_value._0_8_ = local_140[0]._M_value._0_8_;
  m30._M_value._8_8_ = local_150._M_value._8_8_;
  m30._M_value._0_8_ = local_150._M_value._0_8_;
  m31._M_value._8_8_ = d._M_value._0_8_;
  m31._M_value._0_8_ = o._M_value._8_8_;
  m32._M_value._8_8_ = this;
  m32._M_value._0_8_ = in_RSI;
  m33._M_value._8_8_ = o._M_value._8_8_;
  m33._M_value._0_8_ = pRVar4;
  m00._M_value._8_8_ = local_150._M_value._0_8_;
  m00._M_value._0_8_ = local_140[0]._M_value._0_8_;
  m01._M_value._8_8_ = local_140[1]._M_value._0_8_;
  m01._M_value._0_8_ = o._M_value._8_8_;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,m00,m01,m02,m03,m10,m11,m12,m13,m20,m21,m22
             ,m23,m30,m31,m32,m33);
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)pRVar4;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d ,-o , 0 ,
                                                  0 ,-o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }